

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O2

int __thiscall Server::Private::remove(Private *this,char *__filename)

{
  int iVar1;
  Iterator IVar2;
  Item *local_20;
  
  IVar2 = MultiMap<long,_Server::Private::TimerImpl_*>::find
                    (&this->_queuedTimers,(long *)(__filename + 8));
  do {
    if (IVar2.item == (this->_queuedTimers)._end.item) {
LAB_0010c7bd:
      iVar1 = PoolList<Server::Private::TimerImpl>::remove(&this->_timers,__filename);
      return iVar1;
    }
    if ((IVar2.item)->value == (TimerImpl *)__filename) {
      local_20 = IVar2.item;
      MultiMap<long,_Server::Private::TimerImpl_*>::remove(&this->_queuedTimers,(char *)&local_20);
      goto LAB_0010c7bd;
    }
    if ((IVar2.item)->key != *(long *)(__filename + 8)) goto LAB_0010c7bd;
    IVar2.item = (IVar2.item)->next;
  } while( true );
}

Assistant:

void Server::Private::remove(TimerImpl &timer)
{
  for (MultiMap<int64, TimerImpl *>::Iterator i = _queuedTimers.find(timer.executionTime), end = _queuedTimers.end(); i != end; ++i)
  {
    if (*i == &timer)
    {
      _queuedTimers.remove(i);
      break;
    }
    if (i.key() != timer.executionTime)
      break;
  }
  _timers.remove(timer);
}